

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

void __thiscall
duckdb::WindowBoundariesState::FrameEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_end,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  bool bVar1;
  WindowCursor *pWVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  vector<duckdb::Vector,_true> *in_RCX;
  long in_RDX;
  long in_RDI;
  WindowCursor *in_R8;
  unsigned_long n_1;
  long boundary_1;
  unsigned_long partition_end;
  unsigned_long peer_end_1;
  idx_t chunk_idx_6;
  unsigned_long n;
  long boundary;
  unsigned_long partition_begin;
  unsigned_long peer_end;
  idx_t chunk_idx_5;
  unsigned_long cur_partition_1;
  unsigned_long valid_end;
  idx_t chunk_idx_4;
  unsigned_long cur_partition;
  unsigned_long valid_start;
  idx_t chunk_idx_3;
  int64_t computed_start_1;
  idx_t chunk_idx_2;
  int64_t computed_start;
  idx_t chunk_idx_1;
  idx_t chunk_idx;
  idx_t prev_partition;
  idx_t window_end;
  unsigned_long *frame_end_data;
  unsigned_long *valid_end_data;
  unsigned_long *valid_begin_data;
  unsigned_long *peer_end_data;
  unsigned_long *partition_end_data;
  unsigned_long *partition_begin_data;
  WindowCursor *in_stack_fffffffffffffdb8;
  vector<duckdb::Vector,_true> *in_stack_fffffffffffffdc0;
  WindowInputExpression *in_stack_fffffffffffffdc8;
  idx_t in_stack_fffffffffffffdd0;
  idx_t in_stack_fffffffffffffdd8;
  allocator *paVar6;
  WindowInputExpression *in_stack_fffffffffffffde0;
  idx_t in_stack_fffffffffffffde8;
  idx_t in_stack_fffffffffffffdf0;
  ValidityMask *in_stack_fffffffffffffdf8;
  Vector *in_stack_fffffffffffffe08;
  Vector *in_stack_fffffffffffffe10;
  idx_t in_stack_fffffffffffffe18;
  idx_t in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  WindowCursor *in_stack_fffffffffffffe38;
  allocator local_1b1;
  WindowInputExpression *in_stack_fffffffffffffe50;
  idx_t in_stack_fffffffffffffe58;
  FrameBounds *in_stack_fffffffffffffe60;
  allocator local_181;
  string local_180 [32];
  long local_160;
  unsigned_long local_158;
  unsigned_long local_150;
  vector<duckdb::Vector,_true> *local_148;
  unsigned_long local_140;
  undefined1 local_135;
  allocator local_121;
  string local_120 [32];
  long local_100;
  unsigned_long local_f8;
  unsigned_long local_f0;
  vector<duckdb::Vector,_true> *local_e8;
  unsigned_long local_e0;
  unsigned_long local_d8;
  vector<duckdb::Vector,_true> *local_d0;
  unsigned_long local_c8;
  unsigned_long local_c0;
  vector<duckdb::Vector,_true> *local_b8;
  long local_b0;
  vector<duckdb::Vector,_true> *local_a8;
  long local_a0;
  vector<duckdb::Vector,_true> *local_98;
  vector<duckdb::Vector,_true> *local_90;
  optional_ptr<duckdb::WindowCursor,_true> local_80;
  unsigned_long local_78;
  unsigned_long local_70;
  unsigned_long *local_68;
  unsigned_long *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  WindowCursor *local_30;
  vector<duckdb::Vector,_true> *local_28;
  long local_20;
  optional_ptr<duckdb::WindowCursor,_true> local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  vector<duckdb::Vector,_true>::operator[]
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  local_40 = FlatVector::GetData<unsigned_long_const>((Vector *)0x1a34600);
  vector<duckdb::Vector,_true>::operator[]
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  local_48 = FlatVector::GetData<unsigned_long>((Vector *)0x1a34622);
  vector<duckdb::Vector,_true>::operator[]
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  local_50 = FlatVector::GetData<unsigned_long>((Vector *)0x1a34644);
  vector<duckdb::Vector,_true>::operator[]
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  local_58 = FlatVector::GetData<unsigned_long_const>((Vector *)0x1a34666);
  vector<duckdb::Vector,_true>::operator[]
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  local_60 = FlatVector::GetData<unsigned_long_const>((Vector *)0x1a34688);
  vector<duckdb::Vector,_true>::operator[]
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
  local_68 = FlatVector::GetData<unsigned_long>((Vector *)0x1a346aa);
  local_70 = NumericLimits<unsigned_long>::Maximum();
  local_78 = *local_40;
  *(unsigned_long *)(in_RDI + 0x98) = *local_58;
  *(unsigned_long *)(in_RDI + 0xa0) = *local_60;
  if (((*(byte *)(in_RDI + 0x61) & 1) != 0) || ((*(byte *)(in_RDI + 0x62) & 1) != 0)) {
    in_stack_fffffffffffffe38 =
         optional_ptr<duckdb::WindowCursor,_true>::get
                   ((optional_ptr<duckdb::WindowCursor,_true> *)(in_RDI + 0xa8));
    pWVar2 = optional_ptr<duckdb::WindowCursor,_true>::get(&local_8);
    if (in_stack_fffffffffffffe38 != pWVar2) {
      pWVar2 = optional_ptr<duckdb::WindowCursor,_true>::get(&local_8);
      optional_ptr<duckdb::WindowCursor,_true>::optional_ptr(&local_80,pWVar2);
      *(WindowCursor **)(in_RDI + 0xa8) = local_80.ptr;
      optional_ptr<duckdb::WindowCursor,_true>::operator->
                ((optional_ptr<duckdb::WindowCursor,_true> *)in_stack_fffffffffffffdc0);
      WindowCursor::Copy(in_stack_fffffffffffffdb8);
      unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator=
                ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  *)in_stack_fffffffffffffdc0,
                 (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  *)in_stack_fffffffffffffdb8);
      unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::~unique_ptr
                ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  *)0x1a347cb);
    }
  }
  pWVar2 = (WindowCursor *)(ulong)*(byte *)(in_RDI + 0x49);
  switch(pWVar2) {
  case (WindowCursor *)0x0:
  case (WindowCursor *)0x1:
    uVar5 = __cxa_allocate_exception(0x10);
    paVar6 = &local_1b1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe50,"Unsupported window end boundary",paVar6);
    InternalException::InternalException
              ((InternalException *)in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
    __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
  case (WindowCursor *)0x2:
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    Vector::Reference(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    return;
  case (WindowCursor *)0x3:
  case (WindowCursor *)0x9:
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    Vector::Reference(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_68 = local_50;
    break;
  case (WindowCursor *)0x4:
    for (local_90 = (vector<duckdb::Vector,_true> *)0x0; local_90 < local_28;
        local_90 = (vector<duckdb::Vector,_true> *)
                   ((long)&(local_90->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      local_68[(long)local_90] = local_20 + 1;
      local_20 = local_20 + 1;
    }
    break;
  case (WindowCursor *)0x5:
    for (local_98 = (vector<duckdb::Vector,_true> *)0x0; local_98 < local_28;
        local_98 = (vector<duckdb::Vector,_true> *)
                   ((long)&(local_98->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      lVar3 = local_20 + 1;
      lVar4 = WindowInputExpression::GetCell<long>
                        (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      bVar1 = TrySubtractOperator::Operation<long,long,long>(lVar3,lVar4,&local_a0);
      if (bVar1) {
        lVar3 = MaxValue<long>(local_a0,0);
        local_70 = UnsafeNumericCast<unsigned_long,long,void>(lVar3);
      }
      else {
        local_70 = local_48[(long)local_98];
      }
      local_68[(long)local_98] = local_70;
      local_20 = local_20 + 1;
    }
    break;
  case (WindowCursor *)0x6:
    for (local_a8 = (vector<duckdb::Vector,_true> *)0x0; local_a8 < local_28;
        local_a8 = (vector<duckdb::Vector,_true> *)
                   ((long)&(local_a8->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      lVar3 = local_20 + 1;
      lVar4 = WindowInputExpression::GetCell<long>
                        (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      bVar1 = TryAddOperator::Operation<long,long,long>(lVar3,lVar4,&local_b0);
      if (bVar1) {
        lVar3 = MaxValue<long>(local_b0,0);
        local_70 = UnsafeNumericCast<unsigned_long,long,void>(lVar3);
      }
      else {
        local_70 = local_48[(long)local_a8];
      }
      local_68[(long)local_a8] = local_70;
      local_20 = local_20 + 1;
    }
    break;
  case (WindowCursor *)0x7:
    for (local_b8 = (vector<duckdb::Vector,_true> *)0x0; local_b8 < local_28;
        local_b8 = (vector<duckdb::Vector,_true> *)
                   ((long)&(local_b8->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar1 = WindowInputExpression::CellIsNull
                        (in_stack_fffffffffffffdc8,(idx_t)in_stack_fffffffffffffdc0);
      if (bVar1) {
        local_70 = local_50[(long)local_b8];
      }
      else {
        local_c0 = local_58[(long)local_b8];
        *(unsigned_long *)(in_RDI + 0x98) = local_c0;
        local_c8 = local_40[(long)local_b8];
        if (local_c8 != local_78) {
          *(undefined8 *)(in_RDI + 0xa0) = *(undefined8 *)(in_RDI + 0x90);
          local_78 = local_c8;
        }
        optional_ptr<duckdb::WindowCursor,_true>::operator*
                  ((optional_ptr<duckdb::WindowCursor,_true> *)in_stack_fffffffffffffdc0);
        unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator*
                  ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    *)in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffdc8 = (WindowInputExpression *)(in_RDI + 0x98);
        in_stack_fffffffffffffdb8 = local_30;
        in_stack_fffffffffffffdc0 = local_b8;
        local_70 = FindOrderedRangeBound<false>
                             (in_stack_fffffffffffffe38,pWVar2,
                              (OrderType)((ulong)in_stack_fffffffffffffe28 >> 0x38),
                              in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (WindowBoundary)((ulong)in_stack_fffffffffffffe10 >> 0x38),
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe60);
        *(unsigned_long *)(in_RDI + 0xa0) = local_70;
      }
      local_68[(long)local_b8] = local_70;
      local_20 = local_20 + 1;
    }
    break;
  case (WindowCursor *)0x8:
    for (local_d0 = (vector<duckdb::Vector,_true> *)0x0; local_d0 < local_28;
        local_d0 = (vector<duckdb::Vector,_true> *)
                   ((long)&(local_d0->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar1 = WindowInputExpression::CellIsNull
                        (in_stack_fffffffffffffdc8,(idx_t)in_stack_fffffffffffffdc0);
      if (bVar1) {
        local_70 = local_50[(long)local_d0];
      }
      else {
        local_d8 = local_60[(long)local_d0];
        *(unsigned_long *)(in_RDI + 0x98) = local_58[(long)local_d0];
        local_e0 = local_40[(long)local_d0];
        if (local_e0 != local_78) {
          *(unsigned_long *)(in_RDI + 0xa0) = local_d8;
          local_78 = local_e0;
        }
        optional_ptr<duckdb::WindowCursor,_true>::operator*
                  ((optional_ptr<duckdb::WindowCursor,_true> *)in_stack_fffffffffffffdc0);
        unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator*
                  ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    *)in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffdc8 = (WindowInputExpression *)(in_RDI + 0x98);
        in_stack_fffffffffffffdb8 = local_30;
        in_stack_fffffffffffffdc0 = local_d0;
        local_70 = FindOrderedRangeBound<false>
                             (in_stack_fffffffffffffe38,pWVar2,
                              (OrderType)((ulong)in_stack_fffffffffffffe28 >> 0x38),
                              in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (WindowBoundary)((ulong)in_stack_fffffffffffffe10 >> 0x38),
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe60);
        *(unsigned_long *)(in_RDI + 0xa0) = local_70;
      }
      local_68[(long)local_d0] = local_70;
      local_20 = local_20 + 1;
    }
    break;
  case (WindowCursor *)0xa:
    for (local_e8 = (vector<duckdb::Vector,_true> *)0x0; local_e8 < local_28;
        local_e8 = (vector<duckdb::Vector,_true> *)
                   ((long)&(local_e8->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar1 = WindowInputExpression::CellIsNull
                        (in_stack_fffffffffffffdc8,(idx_t)in_stack_fffffffffffffdc0);
      if (bVar1) {
        local_70 = local_50[(long)local_e8];
      }
      else {
        local_f0 = local_50[(long)local_e8];
        local_f8 = local_40[(long)local_e8];
        local_100 = WindowInputExpression::GetCell<long>
                              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        if (local_100 < 0) {
          local_135 = 1;
          uVar5 = __cxa_allocate_exception(0x10);
          paVar6 = &local_121;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_120,"Invalid GROUPS PRECEDING value",paVar6);
          OutOfRangeException::OutOfRangeException
                    ((OutOfRangeException *)in_stack_fffffffffffffdc0,
                     (string *)in_stack_fffffffffffffdb8);
          local_135 = 0;
          __cxa_throw(uVar5,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException
                     );
        }
        if (local_100 == 0) {
          local_70 = local_f0;
        }
        else {
          local_140 = UnsafeNumericCast<unsigned_long,long,void>(local_100);
          local_70 = FindPrevStart(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                   in_stack_fffffffffffffde8,(idx_t *)in_stack_fffffffffffffde0);
        }
      }
      local_68[(long)local_e8] = local_70;
      local_20 = local_20 + 1;
    }
    break;
  case (WindowCursor *)0xb:
    for (local_148 = (vector<duckdb::Vector,_true> *)0x0; local_148 < local_28;
        local_148 = (vector<duckdb::Vector,_true> *)
                    ((long)&(local_148->
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar1 = WindowInputExpression::CellIsNull
                        (in_stack_fffffffffffffdc8,(idx_t)in_stack_fffffffffffffdc0);
      if (bVar1) {
        local_70 = local_50[(long)local_148];
      }
      else {
        local_150 = local_50[(long)local_148];
        local_158 = local_48[(long)local_148];
        local_160 = WindowInputExpression::GetCell<long>
                              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        if (local_160 < 0) {
          uVar5 = __cxa_allocate_exception(0x10);
          paVar6 = &local_181;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_180,"Invalid GROUPS FOLLOWING value",paVar6);
          OutOfRangeException::OutOfRangeException
                    ((OutOfRangeException *)in_stack_fffffffffffffdc0,
                     (string *)in_stack_fffffffffffffdb8);
          __cxa_throw(uVar5,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException
                     );
        }
        if (local_160 == 0) {
          local_70 = local_150;
        }
        else {
          UnsafeNumericCast<unsigned_long,long,void>(local_160);
          local_70 = FindNextStart(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                   in_stack_fffffffffffffde8,(idx_t *)in_stack_fffffffffffffde0);
        }
      }
      local_68[(long)local_148] = local_70;
      local_20 = local_20 + 1;
    }
  }
  ClampFrame(in_stack_fffffffffffffdd0,(idx_t *)in_stack_fffffffffffffdc8,
             (idx_t *)in_stack_fffffffffffffdc0,(idx_t *)in_stack_fffffffffffffdb8);
  return;
}

Assistant:

void WindowBoundariesState::FrameEnd(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                     WindowInputExpression &boundary_end, const ValidityMask &order_mask,
                                     optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_END]);
	auto peer_end_data = FlatVector::GetData<idx_t>(bounds.data[PEER_END]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_end_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_END]);

	idx_t window_end = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (end_boundary) {
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_end_data[chunk_idx] = row_idx + 1;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_END].Reference(bounds.data[PEER_END]);
		frame_end_data = peer_end_data;
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		bounds.data[FRAME_END].Reference(bounds.data[PARTITION_END]);
		// No need to clamp
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS: {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                                    computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	}
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.start = valid_start;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.start = valid_begin_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindPrevStart(order_mask, partition_begin, peer_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindNextStart(order_mask, peer_end + 1, partition_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::UNBOUNDED_PRECEDING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window end boundary");
	}

	ClampFrame(count, frame_end_data, partition_begin_data, partition_end_data);
}